

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

int paeth(int a,int b,int c)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  iVar2 = (b + a) - c;
  uVar4 = iVar2 - a;
  uVar1 = -uVar4;
  if (0 < (int)uVar4) {
    uVar1 = uVar4;
  }
  uVar5 = iVar2 - b;
  uVar4 = -uVar5;
  if (0 < (int)uVar5) {
    uVar4 = uVar5;
  }
  uVar3 = iVar2 - c;
  uVar5 = -uVar3;
  if (0 < (int)uVar3) {
    uVar5 = uVar3;
  }
  if (uVar5 < uVar4) {
    b = c;
  }
  if (uVar5 < uVar1) {
    a = b;
  }
  if (uVar4 < uVar1) {
    a = b;
  }
  return a;
}

Assistant:

static int paeth(int a, int b, int c)
{
   int p = a + b - c;
   int pa = abs(p-a);
   int pb = abs(p-b);
   int pc = abs(p-c);
   if (pa <= pb && pa <= pc) return a;
   if (pb <= pc) return b;
   return c;
}